

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O1

pair<unsigned_long,_bool> __thiscall
google::protobuf::io::CodedInputStream::ReadVarint64Fallback(CodedInputStream *this)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  ulong uVar4;
  undefined7 extraout_var;
  byte *pbVar6;
  uint uVar7;
  int iVar8;
  uint7 uVar9;
  uint uVar10;
  pair<unsigned_long,_bool> pVar11;
  pair<unsigned_long,_bool> pVar12;
  uint64 temp;
  unsigned_long local_10;
  ulong uVar5;
  
  pbVar2 = this->buffer_;
  pbVar6 = this->buffer_end_;
  if (((int)pbVar6 - (int)pbVar2 < 10) && ((pbVar6 <= pbVar2 || ((char)pbVar6[-1] < '\0')))) {
    bVar3 = ReadVarint64Slow(this,&local_10);
    pVar11._8_8_ = CONCAT71(extraout_var,bVar3) & 0xffffffff;
    pVar11.first = local_10;
    return pVar11;
  }
  bVar1 = *pbVar2;
  uVar7 = (uint)bVar1;
  uVar5 = 0;
  uVar4 = 0;
  if ((char)bVar1 < '\0') {
    uVar7 = ((uint)bVar1 + (uint)pbVar2[1] * 0x80) - 0x80;
    if (-1 < (char)pbVar2[1]) {
      pbVar6 = pbVar2 + 2;
      goto LAB_002bdd64;
    }
    uVar7 = (uVar7 + (uint)pbVar2[2] * 0x4000) - 0x4000;
    if (-1 < (char)pbVar2[2]) {
      pbVar6 = pbVar2 + 3;
      goto LAB_002bdd64;
    }
    iVar8 = uVar7 + (uint)pbVar2[3] * 0x200000;
    uVar7 = iVar8 - 0x200000;
    if (-1 < (char)pbVar2[3]) {
      pbVar6 = pbVar2 + 4;
      goto LAB_002bdd64;
    }
    uVar7 = iVar8 + 0xefe00000;
    uVar10 = (uint)pbVar2[4];
    if ((char)pbVar2[4] < '\0') {
      uVar10 = (uVar10 + (uint)pbVar2[5] * 0x80) - 0x80;
      if ((char)pbVar2[5] < '\0') {
        uVar10 = (uVar10 + (uint)pbVar2[6] * 0x4000) - 0x4000;
        if ((char)pbVar2[6] < '\0') {
          iVar8 = uVar10 + (uint)pbVar2[7] * 0x200000;
          uVar10 = iVar8 - 0x200000;
          if ((char)pbVar2[7] < '\0') {
            uVar10 = iVar8 + 0xefe00000;
            bVar1 = pbVar2[8];
            uVar4 = (ulong)bVar1;
            if ((char)bVar1 < '\0') {
              pbVar6 = pbVar2 + 10;
              if ((char)pbVar2[9] < '\0') {
                bVar3 = false;
                uVar9 = 0;
                goto LAB_002bdd7a;
              }
              uVar4 = (ulong)(((uint)bVar1 + (uint)pbVar2[9] * 0x80) - 0x80);
            }
            else {
              pbVar6 = pbVar2 + 9;
            }
          }
          else {
            pbVar6 = pbVar2 + 8;
          }
        }
        else {
          pbVar6 = pbVar2 + 7;
        }
      }
      else {
        pbVar6 = pbVar2 + 6;
        uVar4 = uVar5;
      }
    }
    else {
      pbVar6 = pbVar2 + 5;
      uVar4 = uVar5;
    }
  }
  else {
    pbVar6 = pbVar2 + 1;
LAB_002bdd64:
    uVar10 = 0;
    uVar4 = uVar5;
  }
  uVar4 = uVar4 << 0x38 | (ulong)uVar10 << 0x1c | (ulong)uVar7;
  uVar9 = (uint7)(uint3)(uVar7 >> 8);
  bVar3 = true;
LAB_002bdd7a:
  if (bVar3) {
    this->buffer_ = pbVar6;
    pVar12._9_7_ = uVar9;
    pVar12.second = true;
    pVar12.first = uVar4;
    return pVar12;
  }
  return (pair<unsigned_long,_bool>)ZEXT816(0);
}

Assistant:

inline int CodedInputStream::BufferSize() const {
  return static_cast<int>(buffer_end_ - buffer_);
}